

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::registerValueInterfacesToml(ValueFederate *this,string *tomlString)

{
  string_view target;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view defVal_06;
  string_view type_00;
  string_view type_01;
  string_view name_00;
  string_view name_01;
  string_view units_00;
  string_view units_01;
  string_view key;
  string_view key_00;
  string_view type_02;
  string_view type_03;
  string_view type_04;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  string_view key_01;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar4;
  undefined8 uVar5;
  array_type *paVar6;
  pointer pVVar7;
  Input *pIVar8;
  anon_class_8_1_ba1d534b addDestTarget_2;
  string defStr_1;
  bool global_1;
  string units_2;
  string type_2;
  Input *inp_1;
  string name_2;
  basic_value<toml::type_config> *ipt;
  iterator __end2_2;
  iterator __begin2_2;
  array_type *__range2_2;
  array_type *iptArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *ipts;
  anon_class_8_1_ba1d534b addDestTarget_1;
  string defStr;
  string units_1;
  string type_1;
  Input *inp;
  bool skipNameTarget;
  string name_1;
  basic_value<toml::type_config> *sub;
  iterator __end2_1;
  iterator __begin2_1;
  array_type *__range2_1;
  array_type *subArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *subs;
  anon_class_8_1_66e135f8 addDestTarget;
  bool global;
  string units;
  string type;
  Publication *pubObj;
  string name;
  basic_value<toml::type_config> *pub;
  iterator __end2;
  iterator __begin2;
  array_type *__range2;
  array_type *pubArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *pubs;
  bool defaultGlobal;
  invalid_argument *ia;
  value doc;
  string *in_stack_fffffffffffff1d8;
  Input *in_stack_fffffffffffff1e0;
  char *in_stack_fffffffffffff1e8;
  basic_value<toml::type_config> *in_stack_fffffffffffff1f0;
  basic_value<toml::type_config> *in_stack_fffffffffffff1f8;
  string *in_stack_fffffffffffff200;
  value *in_stack_fffffffffffff208;
  ValueFederateManager *in_stack_fffffffffffff210;
  char *in_stack_fffffffffffff218;
  ValueFederateManager *in_stack_fffffffffffff220;
  allocator<char> *in_stack_fffffffffffff228;
  Input *in_stack_fffffffffffff230;
  Input *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff247;
  size_t in_stack_fffffffffffff250;
  allocator<char> *paVar9;
  char *in_stack_fffffffffffff258;
  ValueFederateManager *pVVar10;
  ValueFederateManager *in_stack_fffffffffffff268;
  allocator<char> *in_stack_fffffffffffff270;
  ValueFederateManager *in_stack_fffffffffffff278;
  ValueFederate *in_stack_fffffffffffff280;
  ValueFederate *this_00;
  undefined7 in_stack_fffffffffffff288;
  undefined1 in_stack_fffffffffffff28f;
  char *in_stack_fffffffffffff290;
  size_t in_stack_fffffffffffff298;
  char *in_stack_fffffffffffff2a0;
  size_t in_stack_fffffffffffff2b0;
  char *in_stack_fffffffffffff2b8;
  allocator<char> *paVar11;
  ValueFederateManager *in_stack_fffffffffffff2c8;
  string *name2;
  string *in_stack_fffffffffffff2d0;
  reference in_stack_fffffffffffff2d8;
  anon_class_8_1_ba1d534b in_stack_fffffffffffff2e0;
  bool *in_stack_fffffffffffff380;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
  *in_stack_fffffffffffff388;
  value *in_stack_fffffffffffff390;
  string *in_stack_fffffffffffff3a0;
  string *loc;
  string *in_stack_fffffffffffff3a8;
  reference in_stack_fffffffffffff3b0;
  Input *objUpdate;
  basic_value<toml::type_config> *data;
  ValueFederate *in_stack_fffffffffffff480;
  string *in_stack_fffffffffffff498;
  string local_b39;
  Input *local_b18;
  undefined1 local_b09 [73];
  Input *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  allocator<char> local_a99 [65];
  __sv_type local_a58;
  __sv_type local_a48;
  __sv_type local_a38;
  __sv_type local_a28;
  __sv_type local_a18;
  __sv_type local_a08;
  allocator<char> local_9f1 [39];
  byte local_9ca;
  allocator<char> local_9c9 [33];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  allocator<char> local_989 [65];
  undefined8 local_948;
  undefined8 uStack_940;
  undefined1 local_929 [81];
  Input *local_8d8;
  ValueFederateManager *local_8b0;
  basic_value<toml::type_config> *local_8a8;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_8a0;
  array_type *local_898;
  array_type *local_890;
  allocator<char> local_871 [33];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_850;
  string local_841;
  Input *local_820;
  string local_811;
  undefined1 local_7e9 [88];
  allocator<char> local_791 [72];
  allocator<char> local_749 [65];
  __sv_type local_708;
  __sv_type local_6f8;
  __sv_type local_6e8;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  allocator<char> local_6b9 [33];
  undefined8 local_698;
  undefined8 uStack_690;
  allocator<char> local_679 [65];
  undefined8 local_638;
  undefined8 uStack_630;
  allocator<char> local_619 [65];
  __sv_type local_5d8;
  Input *local_5c8;
  allocator<char> local_5b9 [40];
  byte local_591;
  reference local_570;
  basic_value<toml::type_config> *local_568;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_560;
  array_type *local_558;
  array_type *local_550;
  undefined1 local_531 [48];
  string local_501;
  Publication *local_4e0;
  string local_4d1;
  allocator<char> local_4a9 [33];
  Publication *local_488;
  allocator<char> local_479 [40];
  allocator<char> local_451 [33];
  Publication *local_430;
  __sv_type local_428;
  __sv_type local_418;
  __sv_type local_408;
  __sv_type local_3f8;
  __sv_type local_3e8;
  __sv_type local_3d8;
  allocator<char> local_3c1 [39];
  undefined1 local_39a;
  allocator<char> local_399 [33];
  undefined8 local_378;
  undefined8 uStack_370;
  allocator<char> local_359 [65];
  undefined8 local_318;
  undefined8 uStack_310;
  allocator<char> local_301 [65];
  __sv_type local_2c0;
  Publication *local_2b0;
  reference local_288;
  basic_value<toml::type_config> *local_280;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_278;
  array_type *local_270;
  array_type *local_268;
  allocator<char> local_249 [33];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_228;
  undefined1 local_219 [40];
  basic_value<toml::type_config> local_1f1 [2];
  
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0);
  fileops::loadToml(in_stack_fffffffffffff498);
  toml::basic_value<toml::type_config>::operator=
            (in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0);
  local_1f1[0].field_1.string_.format.fmt = HELICS_STRING;
  data = (basic_value<toml::type_config> *)(local_219 + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff220,in_stack_fffffffffffff218,
             (allocator<char> *)in_stack_fffffffffffff210);
  fileops::replaceIfMember<bool>
            (in_stack_fffffffffffff390,(string *)in_stack_fffffffffffff388,in_stack_fffffffffffff380
            );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_219 + 0x28));
  objUpdate = (Input *)local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff220,in_stack_fffffffffffff218,
             (allocator<char> *)in_stack_fffffffffffff210);
  bVar1 = fileops::isMember(in_stack_fffffffffffff390,(string *)in_stack_fffffffffffff388);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e0);
  std::allocator<char>::~allocator((allocator<char> *)local_219);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff220,in_stack_fffffffffffff218,
               (allocator<char> *)in_stack_fffffffffffff210);
    peVar4 = toml::find<toml::type_config>
                       ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0,
                        in_stack_fffffffffffff1d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1e0);
    std::allocator<char>::~allocator(local_249);
    local_228 = peVar4;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x286aec);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1f0,
                 in_stack_fffffffffffff1e8);
      message._M_str = (char *)in_stack_fffffffffffff200;
      message._M_len = (size_t)in_stack_fffffffffffff1f8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffff1f0,message);
      __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    local_270 = toml::basic_value<toml::type_config>::as_array
                          ((basic_value<toml::type_config> *)in_stack_fffffffffffff220);
    local_268 = local_270;
    local_278._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_fffffffffffff1d8);
    local_280 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_fffffffffffff1d8);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1e0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1d8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_288 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_278);
      fileops::getName_abi_cxx11_(in_stack_fffffffffffff208);
      std::
      unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>::
      operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                  *)0x286d09);
      local_2c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff1e0);
      key._M_str = &in_stack_fffffffffffff278->useJsonSerialization;
      key._M_len = (size_t)in_stack_fffffffffffff270;
      local_2b0 = ValueFederateManager::getPublication(in_stack_fffffffffffff268,key);
      bVar1 = Interface::isValid((Interface *)0x286d72);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_318 = 0;
        uStack_310 = 0;
        defVal._M_str = in_stack_fffffffffffff218;
        defVal._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_301);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_378 = 0;
        uStack_370 = 0;
        defVal_00._M_str = in_stack_fffffffffffff218;
        defVal_00._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_359);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        fileops::replaceIfMember
                  (in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_399);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        bVar1 = fileops::getOrDefault
                          ((value *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,false);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_3c1);
        local_39a = bVar1;
        if (bVar1) {
          local_3d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_3e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_3f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          name_00._M_str._0_7_ = in_stack_fffffffffffff240;
          name_00._M_len = (size_t)in_stack_fffffffffffff238;
          name_00._M_str._7_1_ = in_stack_fffffffffffff247;
          type_00._M_str = (char *)in_stack_fffffffffffff230;
          type_00._M_len = (size_t)in_stack_fffffffffffff228;
          units_00._M_str = in_stack_fffffffffffff258;
          units_00._M_len = in_stack_fffffffffffff250;
          in_stack_fffffffffffff1d8 = (string *)local_3f8._M_len;
          in_stack_fffffffffffff1e0 = (Input *)local_3f8._M_str;
          local_2b0 = registerGlobalPublication
                                ((ValueFederate *)in_stack_fffffffffffff220,name_00,type_00,units_00
                                );
        }
        else {
          local_408 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_418 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_428 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          name_02._M_str = in_stack_fffffffffffff2a0;
          name_02._M_len = in_stack_fffffffffffff298;
          type_02._M_len._7_1_ = in_stack_fffffffffffff28f;
          type_02._M_len._0_7_ = in_stack_fffffffffffff288;
          type_02._M_str = in_stack_fffffffffffff290;
          units_02._M_str = in_stack_fffffffffffff2b8;
          units_02._M_len = in_stack_fffffffffffff2b0;
          in_stack_fffffffffffff1d8 = (string *)local_428._M_len;
          in_stack_fffffffffffff1e0 = (Input *)local_428._M_str;
          local_2b0 = registerPublication(in_stack_fffffffffffff280,name_02,type_02,units_02);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
      }
      loadOptions<toml::basic_value<toml::type_config>,helics::Publication>
                (in_stack_fffffffffffff480,data,(Publication *)objUpdate);
      local_430 = local_2b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_488 = local_430;
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 (string *)in_stack_fffffffffffff2c8,
                 (anon_class_8_1_66e135f8)in_stack_fffffffffffff2e0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_479);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_451);
      in_stack_fffffffffffff3b0 = local_288;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      in_stack_fffffffffffff3a8 = &local_4d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_4e0 = local_430;
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 (string *)in_stack_fffffffffffff2c8,
                 (anon_class_8_1_66e135f8)in_stack_fffffffffffff2e0.inp);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_4a9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_278);
    }
  }
  loc = (string *)(local_531 + 0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff220,in_stack_fffffffffffff218,
             (allocator<char> *)in_stack_fffffffffffff210);
  bVar1 = fileops::isMember(in_stack_fffffffffffff390,(string *)in_stack_fffffffffffff388);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_531 + 0x30));
  if (bVar1) {
    in_stack_fffffffffffff390 = (value *)local_531;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff220,in_stack_fffffffffffff218,
               (allocator<char> *)in_stack_fffffffffffff210);
    in_stack_fffffffffffff388 =
         toml::find<toml::type_config>
                   ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0,
                    in_stack_fffffffffffff1d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1e0);
    std::allocator<char>::~allocator((allocator<char> *)local_531);
    local_531._33_8_ = in_stack_fffffffffffff388;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x2876da);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1f0,
                 in_stack_fffffffffffff1e8);
      message_00._M_str = (char *)in_stack_fffffffffffff200;
      message_00._M_len = (size_t)in_stack_fffffffffffff1f8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffff1f0,message_00);
      __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    local_558 = toml::basic_value<toml::type_config>::as_array
                          ((basic_value<toml::type_config> *)in_stack_fffffffffffff220);
    local_550 = local_558;
    local_560._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_fffffffffffff1d8);
    local_568 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_fffffffffffff1d8);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1e0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1d8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_570 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_560);
      fileops::getName_abi_cxx11_(in_stack_fffffffffffff208);
      local_591 = 0;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x287899);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        fileops::replaceIfMember(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,loc);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_5b9);
        local_591 = 1;
      }
      std::
      unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>::
      operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                  *)0x287982);
      local_5d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff1e0);
      key_01._M_str = (char *)in_stack_fffffffffffff2d8;
      key_01._M_len = (size_t)in_stack_fffffffffffff2d0;
      local_5c8 = ValueFederateManager::getInputByTarget(in_stack_fffffffffffff2c8,key_01);
      bVar1 = Interface::isValid((Interface *)0x2879eb);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_638 = 0;
        uStack_630 = 0;
        defVal_01._M_str = in_stack_fffffffffffff218;
        defVal_01._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_01);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_619);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_698 = 0;
        uStack_690 = 0;
        defVal_02._M_str = in_stack_fffffffffffff218;
        defVal_02._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_02);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_679);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        fileops::replaceIfMember(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,loc);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_6b9);
        local_6d8 = 0;
        uStack_6d0 = 0;
        local_6e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff1e0);
        local_6f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff1e0);
        name_03._M_str = in_stack_fffffffffffff2a0;
        name_03._M_len = in_stack_fffffffffffff298;
        type_03._M_len._7_1_ = in_stack_fffffffffffff28f;
        type_03._M_len._0_7_ = in_stack_fffffffffffff288;
        type_03._M_str = in_stack_fffffffffffff290;
        units_03._M_str = in_stack_fffffffffffff2b8;
        units_03._M_len = in_stack_fffffffffffff2b0;
        in_stack_fffffffffffff1d8 = (string *)local_6f8._M_len;
        in_stack_fffffffffffff1e0 = (Input *)local_6f8._M_str;
        local_5c8 = registerInput(in_stack_fffffffffffff280,name_03,type_03,units_03);
        if ((local_591 & 1) == 0) {
          local_708 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          target._M_str = (char *)in_stack_fffffffffffff1f0;
          target._M_len = (size_t)in_stack_fffffffffffff1e8;
          Input::addTarget(in_stack_fffffffffffff1e0,target);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_791[0x29] = (allocator<char>)0x0;
      local_791[0x2a] = (allocator<char>)0x0;
      local_791[0x2b] = (allocator<char>)0x0;
      local_791[0x2c] = (allocator<char>)0x0;
      local_791[0x2d] = (allocator<char>)0x0;
      local_791[0x2e] = (allocator<char>)0x0;
      local_791[0x2f] = (allocator<char>)0x0;
      local_791[0x30] = (allocator<char>)0x0;
      local_791[0x31] = (allocator<char>)0x0;
      local_791[0x32] = (allocator<char>)0x0;
      local_791[0x33] = (allocator<char>)0x0;
      local_791[0x34] = (allocator<char>)0x0;
      local_791[0x35] = (allocator<char>)0x0;
      local_791[0x36] = (allocator<char>)0x0;
      local_791[0x37] = (allocator<char>)0x0;
      local_791[0x38] = (allocator<char>)0x0;
      defVal_03._M_str = in_stack_fffffffffffff218;
      defVal_03._M_len = (size_t)in_stack_fffffffffffff210;
      fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_03);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_749);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x287e8e);
      if (!bVar1) {
        Input::setDefault<std::__cxx11::string&>
                  (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
      }
      loadOptions<toml::basic_value<toml::type_config>,helics::Input>
                (in_stack_fffffffffffff480,data,objUpdate);
      local_791._33_8_ = local_5c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_7e9[0x21] = local_791[0x21];
      local_7e9[0x22] = local_791[0x22];
      local_7e9[0x23] = local_791[0x23];
      local_7e9[0x24] = local_791[0x24];
      local_7e9[0x25] = local_791[0x25];
      local_7e9[0x26] = local_791[0x26];
      local_7e9[0x27] = local_791[0x27];
      local_7e9[0x28] = local_791[0x28];
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 (string *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)(local_7e9 + 0x30));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_791);
      in_stack_fffffffffffff2e0.inp = (Input *)local_7e9;
      in_stack_fffffffffffff2d8 = local_570;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      in_stack_fffffffffffff2d0 = &local_811;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_820 = (Input *)local_791._33_8_;
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                 (string *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_811);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)local_7e9);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_560);
    }
  }
  name2 = &local_841;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff220,in_stack_fffffffffffff218,
             (allocator<char> *)in_stack_fffffffffffff210);
  bVar1 = fileops::isMember(in_stack_fffffffffffff390,(string *)in_stack_fffffffffffff388);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  if (bVar1) {
    paVar11 = local_871;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff220,in_stack_fffffffffffff218,
               (allocator<char> *)in_stack_fffffffffffff210);
    peVar4 = toml::find<toml::type_config>
                       ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0,
                        in_stack_fffffffffffff1d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff1e0);
    std::allocator<char>::~allocator(local_871);
    local_850 = peVar4;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x288339);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1f0,
                 in_stack_fffffffffffff1e8);
      message_01._M_str = (char *)in_stack_fffffffffffff200;
      message_01._M_len = (size_t)in_stack_fffffffffffff1f8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffff1f0,message_01);
      __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    paVar6 = toml::basic_value<toml::type_config>::as_array
                       ((basic_value<toml::type_config> *)in_stack_fffffffffffff220);
    local_898 = paVar6;
    local_890 = paVar6;
    local_8a0._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_fffffffffffff1d8);
    local_8a8 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_fffffffffffff1d8);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1e0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff1d8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_8b0 = (ValueFederateManager *)
                  __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_8a0);
      fileops::getName_abi_cxx11_(in_stack_fffffffffffff208);
      pVVar7 = std::
               unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
               ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                             *)0x2884f4);
      local_929._65_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff1e0);
      key_00._M_str = &in_stack_fffffffffffff278->useJsonSerialization;
      key_00._M_len = (size_t)in_stack_fffffffffffff270;
      pIVar8 = ValueFederateManager::getInput(in_stack_fffffffffffff268,key_00);
      local_8d8 = pIVar8;
      uVar2 = Interface::isValid((Interface *)0x28855d);
      if (!(bool)uVar2) {
        this_00 = (ValueFederate *)local_929;
        in_stack_fffffffffffff278 = local_8b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_948 = 0;
        uStack_940 = 0;
        defVal_04._M_str = in_stack_fffffffffffff218;
        defVal_04._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_04);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator((allocator<char> *)local_929);
        in_stack_fffffffffffff270 = local_989;
        in_stack_fffffffffffff268 = local_8b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        local_9a8 = 0;
        uStack_9a0 = 0;
        defVal_05._M_str = in_stack_fffffffffffff218;
        defVal_05._M_len = (size_t)in_stack_fffffffffffff210;
        fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_05);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_989);
        pVVar10 = local_8b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        fileops::replaceIfMember(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,loc);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_9c9);
        paVar9 = local_9f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                   (allocator<char> *)in_stack_fffffffffffff210);
        bVar3 = fileops::getOrDefault
                          ((value *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,false);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::allocator<char>::~allocator(local_9f1);
        local_9ca = bVar3 & 1;
        if (local_9ca == 0) {
          local_a38 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_a48 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_a58 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          name_04._M_str = (char *)paVar6;
          name_04._M_len = (size_t)pIVar8;
          type_04._M_len._7_1_ = uVar2;
          type_04._M_len._0_7_ = in_stack_fffffffffffff288;
          type_04._M_str = &pVVar7->useJsonSerialization;
          units_04._M_str = (char *)paVar11;
          units_04._M_len = (size_t)peVar4;
          in_stack_fffffffffffff1d8 = (string *)local_a58._M_len;
          in_stack_fffffffffffff1e0 = (Input *)local_a58._M_str;
          in_stack_fffffffffffff230 = registerInput(this_00,name_04,type_04,units_04);
          local_8d8 = in_stack_fffffffffffff230;
        }
        else {
          local_a08 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_a18 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          local_a28 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff1e0);
          name_01._M_str._0_7_ = in_stack_fffffffffffff240;
          name_01._M_len = (size_t)in_stack_fffffffffffff238;
          name_01._M_str._7_1_ = bVar3;
          type_01._M_str = (char *)in_stack_fffffffffffff230;
          type_01._M_len = (size_t)in_stack_fffffffffffff228;
          units_01._M_str = &pVVar10->useJsonSerialization;
          units_01._M_len = (size_t)paVar9;
          in_stack_fffffffffffff1d8 = (string *)local_a28._M_len;
          in_stack_fffffffffffff1e0 = (Input *)local_a28._M_str;
          in_stack_fffffffffffff238 =
               registerGlobalInput((ValueFederate *)in_stack_fffffffffffff220,name_01,type_01,
                                   units_01);
          local_8d8 = in_stack_fffffffffffff238;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff1e0);
      }
      in_stack_fffffffffffff228 = local_a99;
      in_stack_fffffffffffff220 = local_8b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_ab8 = 0;
      uStack_ab0 = 0;
      defVal_06._M_str = in_stack_fffffffffffff218;
      defVal_06._M_len = (size_t)in_stack_fffffffffffff210;
      fileops::getOrDefault(in_stack_fffffffffffff208,in_stack_fffffffffffff200,defVal_06);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator(local_a99);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x288b2d);
      if (!bVar1) {
        Input::setDefault<std::__cxx11::string&>
                  (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
      }
      loadOptions<toml::basic_value<toml::type_config>,helics::Input>
                (in_stack_fffffffffffff480,data,objUpdate);
      local_ac0 = local_8d8;
      in_stack_fffffffffffff218 = local_b09 + 0x28;
      in_stack_fffffffffffff210 = local_8b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      in_stack_fffffffffffff208 = (value *)local_b09;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      local_b18 = local_ac0;
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,name2,in_stack_fffffffffffff2e0
                );
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)local_b09);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)(local_b09 + 0x28));
      in_stack_fffffffffffff200 = &local_b39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218,
                 (allocator<char> *)in_stack_fffffffffffff210);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                (in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,name2,in_stack_fffffffffffff2e0
                );
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff49f);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b39);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1e0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_8a0);
    }
  }
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffff1e0);
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "publications")) {
        auto& pubs = toml::find(doc, "publications");
        if (!pubs.is_array()) {
            throw(helics::InvalidParameter("publications section in toml file must be an array"));
        }
        auto& pubArray = pubs.as_array();
        for (const auto& pub : pubArray) {
            auto name = fileops::getName(pub);

            Publication* pubObj = &vfManager->getPublication(name);
            if (!pubObj->isValid()) {
                auto type = getOrDefault(pub, "type", emptyStr);
                auto units = getOrDefault(pub, "unit", emptyStr);
                replaceIfMember(pub, "units", units);
                const bool global = getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubObj = &registerGlobalPublication(name, type, units);
                } else {
                    pubObj = &registerPublication(name, type, units);
                }
            }
            loadOptions(this, pub, *pubObj);
            auto addDestTarget = [pubObj](const std::string& target) {
                pubObj->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "subscriptions")) {
        auto& subs = toml::find(doc, "subscriptions");
        if (!subs.is_array()) {
            // this line is tested in the publications section so not really necessary to check
            // again since it is an expensive test
            throw(helics::InvalidParameter(
                "subscriptions section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& subArray = subs.as_array();
        for (const auto& sub : subArray) {
            auto name = fileops::getName(sub);
            bool skipNameTarget{false};
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            Input* inp = &vfManager->getInputByTarget(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(sub, "type", emptyStr);
                auto units = getOrDefault(sub, "unit", emptyStr);
                replaceIfMember(sub, "units", units);

                inp = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    inp->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, sub, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(sub, "source", "publications", addDestTarget);
            addTargetVariations(sub, "source", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "inputs")) {
        auto& ipts = toml::find(doc, "inputs");
        if (!ipts.is_array()) {
            throw(helics::InvalidParameter(
                "inputs section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& iptArray = ipts.as_array();
        for (const auto& ipt : iptArray) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(ipt, "type", emptyStr);
                auto units = getOrDefault(ipt, "unit", emptyStr);
                replaceIfMember(ipt, "units", units);
                const bool global = getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(ipt, "source", "publications", addDestTarget);
            addTargetVariations(ipt, "source", "targets", addDestTarget);
        }
    }
}